

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
DirectChainedMap<IdentifierLookupResult>::insert
          (DirectChainedMap<IdentifierLookupResult> *this,uint hash,IdentifierLookupResult value)

{
  Node *pNVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  uint uVar7;
  Node *pNVar6;
  
  uVar3 = this->bucketCount;
  uVar7 = this->count;
  if (uVar3 <= (uVar7 >> 2) + uVar7) {
    rehash(this);
    uVar3 = this->bucketCount;
    uVar7 = this->count;
  }
  this->count = uVar7 + 1;
  lVar5 = (ulong)(uVar3 - 1 & hash) * 0x20;
  pNVar1 = this->data + lVar5;
  if (*(long *)(this->data + lVar5 + 0x18) == 0) {
    *(uint *)pNVar1 = hash;
    pNVar6 = pNVar1;
  }
  else {
    iVar4 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x20);
    pNVar6 = (Node *)CONCAT44(extraout_var,iVar4);
    *(uint *)pNVar6 = *(uint *)pNVar1;
    uVar2 = *(undefined8 *)(pNVar1 + 0x10);
    *(undefined8 *)(pNVar6 + 8) = *(undefined8 *)(pNVar1 + 8);
    *(undefined8 *)(pNVar6 + 0x10) = uVar2;
    *(undefined8 *)(pNVar6 + 0x18) = *(undefined8 *)(pNVar1 + 0x18);
    *(uint *)pNVar1 = hash;
  }
  *(VariableData **)(pNVar1 + 8) = value.variable;
  *(FunctionData **)(pNVar1 + 0x10) = value.function;
  *(Node **)(pNVar1 + 0x18) = pNVar6;
  return;
}

Assistant:

void insert(unsigned hash, Value value)
	{
		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		count++;

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *target = &data[bucket];

		if(target->next == NULL)
		{
			target->hash = hash;
			target->value = value;
			target->next = target; // Cycle lets us know that this is the last node
		}
		else
		{
			Node *n = (Node*)allocator->alloc(sizeof(Node));

			n->hash = target->hash;
			n->value = target->value;
			n->next = target->next;

			target->hash = hash;
			target->value = value;
			target->next = n;
		}
	}